

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_he_2008.h
# Opt level: O0

void __thiscall CircularBuffer<int>::Create(CircularBuffer<int> *this,size_t capacity)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  int *piVar3;
  size_t capacity_local;
  CircularBuffer<int> *this_local;
  
  if (this->buffer_ != (int *)0x0) {
    operator_delete__(this->buffer_);
  }
  this->capacity_ = 0;
  this->size_ = 0;
  this->tail_ = 0;
  this->head_ = 0;
  this->buffer_ = (int *)0x0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = capacity;
  uVar2 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  piVar3 = (int *)operator_new__(uVar2);
  this->buffer_ = piVar3;
  this->capacity_ = capacity;
  return;
}

Assistant:

void Create(size_t capacity) {
        delete[] buffer_;

        capacity_ = 0;
        size_ = 0;
        tail_ = 0;
        head_ = 0;
        buffer_ = nullptr;

        buffer_ = new T[capacity];
        capacity_ = capacity;
    }